

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

PaError OpenStream(PaUtilHostApiRepresentation *hostApi,PaStream **s,
                  PaStreamParameters *inputParameters,PaStreamParameters *outputParameters,
                  double sampleRate,unsigned_long framesPerBuffer,PaStreamFlags streamFlags,
                  PaStreamCallback *streamCallback,void *userData)

{
  PaUtilStreamRepresentation *streamRepresentation;
  unsigned_long uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  PaSampleFormat local_b0;
  PaSampleFormat hostOutputSampleFormat;
  PaSampleFormat hostInputSampleFormat;
  PaSampleFormat outputSampleFormat;
  PaSampleFormat inputSampleFormat;
  int outputChannelCount;
  int inputChannelCount;
  unsigned_long framesPerHostBuffer;
  PaSkeletonStream *stream;
  PaSkeletonHostApiRepresentation *skeletonHostApi;
  PaError result;
  PaStreamFlags streamFlags_local;
  unsigned_long framesPerBuffer_local;
  double sampleRate_local;
  PaStreamParameters *outputParameters_local;
  PaStreamParameters *inputParameters_local;
  PaStream **s_local;
  PaUtilHostApiRepresentation *hostApi_local;
  
  if (inputParameters == (PaStreamParameters *)0x0) {
    inputSampleFormat._4_4_ = 0;
    hostOutputSampleFormat = 8;
    outputSampleFormat = 8;
  }
  else {
    inputSampleFormat._4_4_ = inputParameters->channelCount;
    outputSampleFormat = inputParameters->sampleFormat;
    if (inputParameters->device == -2) {
      return -0x270c;
    }
    if (hostApi->deviceInfos[inputParameters->device]->maxInputChannels < inputSampleFormat._4_4_) {
      return -0x270e;
    }
    if (inputParameters->hostApiSpecificStreamInfo != (void *)0x0) {
      return -0x2700;
    }
    hostOutputSampleFormat = PaUtil_SelectClosestAvailableFormat(8,outputSampleFormat);
  }
  if (outputParameters == (PaStreamParameters *)0x0) {
    inputSampleFormat._0_4_ = 0;
    local_b0 = 8;
    hostInputSampleFormat = 8;
  }
  else {
    inputSampleFormat._0_4_ = outputParameters->channelCount;
    hostInputSampleFormat = outputParameters->sampleFormat;
    if (outputParameters->device == -2) {
      return -0x270c;
    }
    if (hostApi->deviceInfos[outputParameters->device]->maxOutputChannels < (int)inputSampleFormat)
    {
      return -0x270e;
    }
    if (outputParameters->hostApiSpecificStreamInfo != (void *)0x0) {
      return -0x2700;
    }
    local_b0 = PaUtil_SelectClosestAvailableFormat(8,hostInputSampleFormat);
  }
  if ((streamFlags & 0xffff0000) == 0) {
    streamRepresentation = (PaUtilStreamRepresentation *)PaUtil_AllocateMemory(0x1a0);
    if (streamRepresentation == (PaUtilStreamRepresentation *)0x0) {
      skeletonHostApi._4_4_ = -0x2708;
    }
    else {
      if (streamCallback == (PaStreamCallback *)0x0) {
        PaUtil_InitializeStreamRepresentation
                  (streamRepresentation,(PaUtilStreamInterface *)&hostApi[2].info.deviceCount,
                   (PaStreamCallback *)0x0,userData);
      }
      else {
        PaUtil_InitializeStreamRepresentation
                  (streamRepresentation,(PaUtilStreamInterface *)(hostApi + 1),streamCallback,
                   userData);
      }
      PaUtil_InitializeCpuLoadMeasurer
                ((PaUtilCpuLoadMeasurer *)(streamRepresentation + 1),sampleRate);
      skeletonHostApi._4_4_ =
           PaUtil_InitializeBufferProcessor
                     ((PaUtilBufferProcessor *)&streamRepresentation[1].streamCallback,
                      inputSampleFormat._4_4_,outputSampleFormat,hostOutputSampleFormat,
                      (int)inputSampleFormat,hostInputSampleFormat,local_b0,sampleRate,streamFlags,
                      framesPerBuffer,framesPerBuffer,paUtilFixedHostBufferSize,streamCallback,
                      userData);
      if (skeletonHostApi._4_4_ == 0) {
        uVar1 = PaUtil_GetBufferProcessorInputLatencyFrames
                          ((PaUtilBufferProcessor *)&streamRepresentation[1].streamCallback);
        auVar2._8_4_ = (int)(uVar1 >> 0x20);
        auVar2._0_8_ = uVar1;
        auVar2._12_4_ = 0x45300000;
        (streamRepresentation->streamInfo).inputLatency =
             ((auVar2._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / sampleRate;
        uVar1 = PaUtil_GetBufferProcessorOutputLatencyFrames
                          ((PaUtilBufferProcessor *)&streamRepresentation[1].streamCallback);
        auVar3._8_4_ = (int)(uVar1 >> 0x20);
        auVar3._0_8_ = uVar1;
        auVar3._12_4_ = 0x45300000;
        (streamRepresentation->streamInfo).outputLatency =
             ((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / sampleRate;
        (streamRepresentation->streamInfo).sampleRate = sampleRate;
        streamRepresentation[5].nextOpenStream = (PaUtilStreamRepresentation *)framesPerBuffer;
        *s = streamRepresentation;
        return 0;
      }
    }
    if (streamRepresentation != (PaUtilStreamRepresentation *)0x0) {
      PaUtil_FreeMemory(streamRepresentation);
    }
    hostApi_local._4_4_ = skeletonHostApi._4_4_;
  }
  else {
    hostApi_local._4_4_ = -0x270b;
  }
  return hostApi_local._4_4_;
}

Assistant:

static PaError OpenStream( struct PaUtilHostApiRepresentation *hostApi,
                           PaStream** s,
                           const PaStreamParameters *inputParameters,
                           const PaStreamParameters *outputParameters,
                           double sampleRate,
                           unsigned long framesPerBuffer,
                           PaStreamFlags streamFlags,
                           PaStreamCallback *streamCallback,
                           void *userData )
{
    PaError result = paNoError;
    PaSkeletonHostApiRepresentation *skeletonHostApi = (PaSkeletonHostApiRepresentation*)hostApi;
    PaSkeletonStream *stream = 0;
    unsigned long framesPerHostBuffer = framesPerBuffer; /* these may not be equivalent for all implementations */
    int inputChannelCount, outputChannelCount;
    PaSampleFormat inputSampleFormat, outputSampleFormat;
    PaSampleFormat hostInputSampleFormat, hostOutputSampleFormat;


    if( inputParameters )
    {
        inputChannelCount = inputParameters->channelCount;
        inputSampleFormat = inputParameters->sampleFormat;

        /* unless alternate device specification is supported, reject the use of
            paUseHostApiSpecificDeviceSpecification */

        if( inputParameters->device == paUseHostApiSpecificDeviceSpecification )
            return paInvalidDevice;

        /* check that input device can support inputChannelCount */
        if( inputChannelCount > hostApi->deviceInfos[ inputParameters->device ]->maxInputChannels )
            return paInvalidChannelCount;

        /* validate inputStreamInfo */
        if( inputParameters->hostApiSpecificStreamInfo )
            return paIncompatibleHostApiSpecificStreamInfo; /* this implementation doesn't use custom stream info */

        /* IMPLEMENT ME - establish which  host formats are available */
        hostInputSampleFormat =
            PaUtil_SelectClosestAvailableFormat( paInt16 /* native formats */, inputSampleFormat );
    }
    else
    {
        inputChannelCount = 0;
        inputSampleFormat = hostInputSampleFormat = paInt16; /* Surpress 'uninitialised var' warnings. */
    }

    if( outputParameters )
    {
        outputChannelCount = outputParameters->channelCount;
        outputSampleFormat = outputParameters->sampleFormat;
        
        /* unless alternate device specification is supported, reject the use of
            paUseHostApiSpecificDeviceSpecification */

        if( outputParameters->device == paUseHostApiSpecificDeviceSpecification )
            return paInvalidDevice;

        /* check that output device can support inputChannelCount */
        if( outputChannelCount > hostApi->deviceInfos[ outputParameters->device ]->maxOutputChannels )
            return paInvalidChannelCount;

        /* validate outputStreamInfo */
        if( outputParameters->hostApiSpecificStreamInfo )
            return paIncompatibleHostApiSpecificStreamInfo; /* this implementation doesn't use custom stream info */

        /* IMPLEMENT ME - establish which  host formats are available */
        hostOutputSampleFormat =
            PaUtil_SelectClosestAvailableFormat( paInt16 /* native formats */, outputSampleFormat );
    }
    else
    {
        outputChannelCount = 0;
        outputSampleFormat = hostOutputSampleFormat = paInt16; /* Surpress 'uninitialized var' warnings. */
    }

    /*
        IMPLEMENT ME:

        ( the following two checks are taken care of by PaUtil_InitializeBufferProcessor() FIXME - checks needed? )

            - check that input device can support inputSampleFormat, or that
                we have the capability to convert from outputSampleFormat to
                a native format

            - check that output device can support outputSampleFormat, or that
                we have the capability to convert from outputSampleFormat to
                a native format

            - if a full duplex stream is requested, check that the combination
                of input and output parameters is supported

            - check that the device supports sampleRate

            - alter sampleRate to a close allowable rate if possible / necessary

            - validate suggestedInputLatency and suggestedOutputLatency parameters,
                use default values where necessary
    */




    /* validate platform specific flags */
    if( (streamFlags & paPlatformSpecificFlags) != 0 )
        return paInvalidFlag; /* unexpected platform specific flag */


    stream = (PaSkeletonStream*)PaUtil_AllocateMemory( sizeof(PaSkeletonStream) );
    if( !stream )
    {
        result = paInsufficientMemory;
        goto error;
    }

    if( streamCallback )
    {
        PaUtil_InitializeStreamRepresentation( &stream->streamRepresentation,
                                               &skeletonHostApi->callbackStreamInterface, streamCallback, userData );
    }
    else
    {
        PaUtil_InitializeStreamRepresentation( &stream->streamRepresentation,
                                               &skeletonHostApi->blockingStreamInterface, streamCallback, userData );
    }

    PaUtil_InitializeCpuLoadMeasurer( &stream->cpuLoadMeasurer, sampleRate );


    /* we assume a fixed host buffer size in this example, but the buffer processor
        can also support bounded and unknown host buffer sizes by passing 
        paUtilBoundedHostBufferSize or paUtilUnknownHostBufferSize instead of
        paUtilFixedHostBufferSize below. */
        
    result =  PaUtil_InitializeBufferProcessor( &stream->bufferProcessor,
              inputChannelCount, inputSampleFormat, hostInputSampleFormat,
              outputChannelCount, outputSampleFormat, hostOutputSampleFormat,
              sampleRate, streamFlags, framesPerBuffer,
              framesPerHostBuffer, paUtilFixedHostBufferSize,
              streamCallback, userData );
    if( result != paNoError )
        goto error;


    /*
        IMPLEMENT ME: initialise the following fields with estimated or actual
        values.
    */
    stream->streamRepresentation.streamInfo.inputLatency =
            (PaTime)PaUtil_GetBufferProcessorInputLatencyFrames(&stream->bufferProcessor) / sampleRate; /* inputLatency is specified in _seconds_ */
    stream->streamRepresentation.streamInfo.outputLatency =
            (PaTime)PaUtil_GetBufferProcessorOutputLatencyFrames(&stream->bufferProcessor) / sampleRate; /* outputLatency is specified in _seconds_ */
    stream->streamRepresentation.streamInfo.sampleRate = sampleRate;

    
    /*
        IMPLEMENT ME:
            - additional stream setup + opening
    */

    stream->framesPerHostCallback = framesPerHostBuffer;

    *s = (PaStream*)stream;

    return result;

error:
    if( stream )
        PaUtil_FreeMemory( stream );

    return result;
}